

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

iterator __thiscall CP::vector<int>::insert(vector<int> *this,iterator it,int *element)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  lVar4 = (long)it - (long)this->mData;
  ensureCapacity(this,this->mSize + 1);
  piVar1 = this->mData;
  uVar2 = this->mSize;
  for (uVar3 = uVar2; (ulong)(lVar4 >> 2) < uVar3; uVar3 = uVar3 - 1) {
    piVar1[uVar3] = piVar1[uVar3 - 1];
  }
  *(int *)((long)piVar1 + lVar4) = *element;
  this->mSize = uVar2 + 1;
  return (iterator)((long)piVar1 + lVar4);
}

Assistant:

iterator insert(iterator it,const T& element) {
      size_t pos = it - begin();
      ensureCapacity(mSize + 1);
      for(size_t i = mSize;i > pos;i--) {
        mData[i] = mData[i-1];
      }
      mData[pos] = element;
      mSize++;
      return begin()+pos;
    }